

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_decoder.h
# Opt level: O1

void __thiscall
draco::MeshEdgebreakerTraversalDecoder::MeshEdgebreakerTraversalDecoder
          (MeshEdgebreakerTraversalDecoder *this)

{
  DecoderBuffer::DecoderBuffer(&this->buffer_);
  DecoderBuffer::DecoderBuffer(&this->symbol_buffer_);
  RAnsBitDecoder::RAnsBitDecoder(&this->start_face_decoder_);
  DecoderBuffer::DecoderBuffer(&this->start_face_buffer_);
  (this->attribute_connectivity_decoders_)._M_t.
  super___uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_>._M_t.
  super__Tuple_impl<0UL,_draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>.
  super__Head_base<0UL,_draco::RAnsBitDecoder_*,_false>._M_head_impl = (RAnsBitDecoder *)0x0;
  this->num_attribute_data_ = 0;
  this->decoder_impl_ = (MeshEdgebreakerDecoderImplInterface *)0x0;
  return;
}

Assistant:

MeshEdgebreakerTraversalDecoder()
      : attribute_connectivity_decoders_(nullptr),
        num_attribute_data_(0),
        decoder_impl_(nullptr) {}